

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton_test.cpp
# Opt level: O2

int main(void)

{
  int *piVar1;
  int *piVar2;
  ostream *poVar3;
  char *pcVar4;
  
  piVar1 = Singleton<int>::GetInstance();
  piVar2 = Singleton<int>::GetInstance();
  pcVar4 = "Singleton False";
  if (piVar1 == piVar2) {
    pcVar4 = "Singleton True";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int main()
{
	int & a = Singleton<int>::GetInstance();
	int & b = Singleton<int>::GetInstance();
	
	if ((&a) == (&b))
	{
		cout << "Singleton True" << endl;
	}
	else
	{
		cout << "Singleton False" << endl;
	}
}